

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

bool google::SendEmailInternal(char *dest,char *subject,char *body,bool use_logging)

{
  LogMessageData *pLVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  long *plVar6;
  undefined8 *puVar7;
  FILE *__s;
  uint *puVar8;
  undefined7 in_register_00000009;
  ulong *puVar9;
  int err;
  int err_00;
  undefined1 *puVar10;
  undefined8 uVar11;
  LogStream *pLVar12;
  byte bVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string cmd;
  allocator<char> local_149;
  string local_148;
  undefined4 local_124;
  LogMessage local_120;
  undefined1 local_110 [16];
  LogMessage local_100;
  undefined1 *local_f0 [2];
  long *local_e0;
  long local_d8;
  long local_d0;
  char acStack_c8 [8];
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  LogMessage local_40;
  
  if ((dest != (char *)0x0) && (*dest != '\0')) {
    local_124 = (undefined4)CONCAT71(in_register_00000009,use_logging);
    if (use_logging) {
      if (*SendEmailInternal::vlocal__ < 1) {
        bVar3 = false;
      }
      else {
        bVar3 = true;
        if (SendEmailInternal::vlocal__ == &kLogSiteUninitialized) {
          bVar3 = InitVLOG3__(&SendEmailInternal::vlocal__,&fLI::FLAGS_v,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                              ,1);
        }
      }
      if (bVar3 != false) {
        LogMessage::LogMessage
                  (&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x722);
        pLVar12 = &(local_40.data_)->stream_;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pLVar12->super_ostream,"Trying to send TITLE:",0x15);
        if (subject == (char *)0x0) {
          std::ios::clear((int)(pLVar12->super_ostream)._vptr_basic_ostream[-3] + (int)pLVar12);
        }
        else {
          sVar5 = strlen(subject);
          std::__ostream_insert<char,std::char_traits<char>>(&pLVar12->super_ostream,subject,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar12->super_ostream," BODY:",6);
        if (body == (char *)0x0) {
          std::ios::clear((int)(pLVar12->super_ostream)._vptr_basic_ostream[-3] + (int)pLVar12);
        }
        else {
          sVar5 = strlen(body);
          std::__ostream_insert<char,std::char_traits<char>>(&pLVar12->super_ostream,body,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar12->super_ostream," to ",4);
        sVar5 = strlen(dest);
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar12->super_ostream,dest,sVar5);
        if (bVar3 != false) {
          LogMessage::~LogMessage(&local_40);
        }
      }
    }
    else {
      fprintf(_stderr,"Trying to send TITLE: %s BODY: %s to %s\n",subject,body,dest);
    }
    local_100.allocated_ = (LogMessageData *)local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,*fLS::FLAGS_logmailer_abi_cxx11_,
               fLS::FLAGS_logmailer_abi_cxx11_[1] + *fLS::FLAGS_logmailer_abi_cxx11_);
    std::__cxx11::string::append((char *)&local_100);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,subject,&local_149);
    ShellEscape(&local_a0,&local_60);
    puVar10 = (undefined1 *)0xf;
    if (local_100.allocated_ != (LogMessageData *)local_f0) {
      puVar10 = local_f0[0];
    }
    if (puVar10 < (local_100.data_)->message_text_ + (local_a0._M_string_length - 4)) {
      uVar11 = (undefined1 *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar11 = local_a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < (local_100.data_)->message_text_ + (local_a0._M_string_length - 4))
      goto LAB_0011f892;
      plVar6 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_a0,0,(char *)0x0,(ulong)local_100.allocated_);
    }
    else {
LAB_0011f892:
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_100,(ulong)local_a0._M_dataplus._M_p);
    }
    local_120.allocated_ = (LogMessageData *)local_110;
    pLVar1 = (LogMessageData *)(plVar6 + 2);
    if ((LogMessageData *)*plVar6 == pLVar1) {
      local_110._0_4_ = pLVar1->preserved_errno_;
      local_110[4] = pLVar1->message_text_[0];
      local_110[5] = pLVar1->message_text_[1];
      local_110[6] = pLVar1->message_text_[2];
      local_110[7] = pLVar1->message_text_[3];
      local_110._8_8_ = plVar6[3];
    }
    else {
      local_110._0_4_ = pLVar1->preserved_errno_;
      local_110[4] = pLVar1->message_text_[0];
      local_110[5] = pLVar1->message_text_[1];
      local_110[6] = pLVar1->message_text_[2];
      local_110[7] = pLVar1->message_text_[3];
      local_120.allocated_ = (LogMessageData *)*plVar6;
    }
    local_120.data_ = (LogMessageData *)plVar6[1];
    *plVar6 = (long)pLVar1;
    plVar6[1] = 0;
    *(undefined1 *)&pLVar1->preserved_errno_ = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_120);
    paVar2 = &local_148.field_2;
    puVar9 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_148.field_2._M_allocated_capacity = *puVar9;
      local_148.field_2._8_8_ = plVar6[3];
      local_148._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *puVar9;
      local_148._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_148._M_string_length = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    sVar5 = strlen(dest);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,dest,dest + sVar5);
    ShellEscape(&local_c0,&local_80);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar2) {
      uVar11 = local_148.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_148._M_string_length + local_c0._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        uVar11 = local_c0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_148._M_string_length + local_c0._M_string_length) goto LAB_0011f9dc;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_c0,0,(char *)0x0,(ulong)local_148._M_dataplus._M_p);
    }
    else {
LAB_0011f9dc:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_c0._M_dataplus._M_p);
    }
    local_e0 = &local_d0;
    plVar6 = puVar7 + 2;
    if ((long *)*puVar7 == plVar6) {
      local_d0 = *plVar6;
      acStack_c8 = (char  [8])puVar7[3];
    }
    else {
      local_d0 = *plVar6;
      local_e0 = (long *)*puVar7;
    }
    local_d8 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)plVar6 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (local_120.allocated_ != (LogMessageData *)local_110) {
      operator_delete(local_120.allocated_,local_110._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,(ulong)(local_a0.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_100.allocated_ != (LogMessageData *)local_f0) {
      operator_delete(local_100.allocated_,(ulong)(local_f0[0] + 1));
    }
    if (*SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__ < 4) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
      if (SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__ ==
          &kLogSiteUninitialized) {
        bVar3 = InitVLOG3__(&SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__,
                            &fLI::FLAGS_v,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                            ,4);
      }
    }
    if (bVar3 != false) {
      LogMessage::LogMessage
                (&local_120,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x72c);
      pLVar12 = &(local_120.data_)->stream_;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pLVar12->super_ostream,"Mailing command: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                (&pLVar12->super_ostream,(char *)local_e0,local_d8);
      if (bVar3 != false) {
        LogMessage::~LogMessage(&local_120);
      }
    }
    __s = popen((char *)local_e0,"w");
    if (__s == (FILE *)0x0) {
      if ((char)local_124 == '\0') {
        fprintf(_stderr,"Unable to send mail to %s\n",dest);
      }
      else {
        LogMessage::LogMessage
                  ((LogMessage *)&local_148,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x740,2);
        body = (char *)(local_148._M_string_length + 0x7538);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)body,"Unable to send mail to ",0x17);
        sVar5 = strlen(dest);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)body,dest,sVar5);
        LogMessage::~LogMessage((LogMessage *)&local_148);
      }
    }
    else {
      if (body != (char *)0x0) {
        sVar5 = strlen(body);
        fwrite(body,1,sVar5,__s);
      }
      iVar4 = pclose(__s);
      body = (char *)(ulong)(iVar4 != -1);
      if (iVar4 == -1) {
        if ((char)local_124 == '\0') {
          puVar8 = (uint *)__errno_location();
          StrError_abi_cxx11_(&local_148,(google *)(ulong)*puVar8,err_00);
          SendEmailInternal();
        }
        else {
          LogMessage::LogMessage
                    (&local_100,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                     ,0x736,2);
          pLVar12 = &(local_100.data_)->stream_;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pLVar12->super_ostream,"Problems sending mail to ",0x19);
          sVar5 = strlen(dest);
          std::__ostream_insert<char,std::char_traits<char>>(&pLVar12->super_ostream,dest,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>(&pLVar12->super_ostream,": ",2);
          puVar8 = (uint *)__errno_location();
          StrError_abi_cxx11_(&local_148,(google *)(ulong)*puVar8,err);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pLVar12->super_ostream,local_148._M_dataplus._M_p,local_148._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          LogMessage::~LogMessage(&local_100);
        }
        body = (char *)0x0;
      }
    }
    bVar13 = (byte)body;
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if (__s != (FILE *)0x0) goto LAB_0011fd4f;
  }
  bVar13 = 0;
LAB_0011fd4f:
  return (bool)(bVar13 & 1);
}

Assistant:

static bool SendEmailInternal(const char*dest, const char *subject,
                              const char*body, bool use_logging) {
  if (dest && *dest) {
    if ( use_logging ) {
      VLOG(1) << "Trying to send TITLE:" << subject
              << " BODY:" << body << " to " << dest;
    } else {
      fprintf(stderr, "Trying to send TITLE: %s BODY: %s to %s\n",
              subject, body, dest);
    }

    string cmd =
        FLAGS_logmailer + " -s" +
        ShellEscape(subject) + " " + ShellEscape(dest);
    VLOG(4) << "Mailing command: " << cmd;

    FILE* pipe = popen(cmd.c_str(), "w");
    if (pipe != NULL) {
      // Add the body if we have one
      if (body)
        fwrite(body, sizeof(char), strlen(body), pipe);
      bool ok = pclose(pipe) != -1;
      if ( !ok ) {
        if ( use_logging ) {
          LOG(ERROR) << "Problems sending mail to " << dest << ": "
                     << StrError(errno);
        } else {
          fprintf(stderr, "Problems sending mail to %s: %s\n",
                  dest, StrError(errno).c_str());
        }
      }
      return ok;
    } else {
      if ( use_logging ) {
        LOG(ERROR) << "Unable to send mail to " << dest;
      } else {
        fprintf(stderr, "Unable to send mail to %s\n", dest);
      }
    }
  }
  return false;
}